

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_c_function_data_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  undefined2 uVar1;
  JSValueUnion JVar2;
  JSValue JVar3;
  JSValueUnion *pJVar4;
  int iVar5;
  JSContext *pJVar6;
  JSContext *pJVar7;
  JSValueUnion JVar8;
  JSValueUnion *pJVar9;
  JSValueUnion JStack_78;
  JSValueUnion local_70 [2];
  int local_5c;
  JSValueUnion *pJStack_58;
  int i;
  JSValue *arg_buf;
  JSCFunctionDataRecord *s;
  JSContext *pJStack_40;
  int argc_local;
  JSContext *ctx_local;
  JSValue this_val_local;
  JSValue func_obj_local;
  
  this_val_local.u = (JSValueUnion)this_val.tag;
  ctx_local = (JSContext *)this_val.u;
  this_val_local.tag = (int64_t)func_obj.u;
  pJVar9 = &JStack_78;
  s._4_4_ = argc;
  pJStack_40 = ctx;
  arg_buf = (JSValue *)JS_GetOpaque(func_obj,0xf);
  JVar8 = this_val_local.u;
  pJVar7 = ctx_local;
  pJVar6 = pJStack_40;
  iVar5 = s._4_4_;
  if (s._4_4_ < (int)(uint)(byte)arg_buf->tag) {
    pJVar9 = &JStack_78 + (ulong)(byte)arg_buf->tag * -2;
    for (local_5c = 0; local_5c < s._4_4_; local_5c = local_5c + 1) {
      pJVar9[(long)local_5c * 2] = argv[local_5c].u;
      (pJVar9 + (long)local_5c * 2)[1] = (JSValueUnion)argv[local_5c].tag;
    }
    for (local_5c = s._4_4_; pJStack_58 = pJVar9, local_5c < (int)(uint)(byte)arg_buf->tag;
        local_5c = local_5c + 1) {
      local_70[0]._0_4_ = 0;
      local_70[1] = (JSValueUnion)0x3;
      pJVar9[(long)local_5c * 2].ptr = (void *)((ulong)(uint)local_70[0]._4_4_ << 0x20);
      (pJVar9 + (long)local_5c * 2)[1].float64 = 1.48219693752374e-323;
    }
  }
  else {
    pJStack_58 = &argv->u;
  }
  pJVar4 = pJStack_58;
  JVar2 = arg_buf->u;
  uVar1 = *(undefined2 *)((long)&arg_buf->tag + 2);
  pJVar9[-2].ptr = arg_buf + 1;
  pJVar9[-3].float64 = 5.77056816767076e-318;
  JVar3 = (JSValue)(*(code *)JVar2)(pJVar6,pJVar7,JVar8.float64,iVar5,pJVar4,uVar1);
  return JVar3;
}

Assistant:

static JSValue js_c_function_data_call(JSContext *ctx, JSValueConst func_obj,
                                       JSValueConst this_val,
                                       int argc, JSValueConst *argv, int flags)
{
    JSCFunctionDataRecord *s = JS_GetOpaque(func_obj, JS_CLASS_C_FUNCTION_DATA);
    JSValueConst *arg_buf;
    int i;

    /* XXX: could add the function on the stack for debug */
    if (unlikely(argc < s->length)) {
        arg_buf = alloca(sizeof(arg_buf[0]) * s->length);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < s->length; i++)
            arg_buf[i] = JS_UNDEFINED;
    } else {
        arg_buf = argv;
    }

    return s->func(ctx, this_val, argc, arg_buf, s->magic, s->data);
}